

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall Polymerase::Move(Polymerase *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  bool bVar4;
  SpeciesTracker *pSVar5;
  
  bVar4 = std::operator==(&(this->super_MobileElement).name_,"__ribosome");
  if (bVar4) {
    pSVar5 = SpeciesTracker::Instance();
    if ((pSVar5->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      iVar3 = 3;
      goto LAB_00113a9b;
    }
  }
  iVar3 = 1;
LAB_00113a9b:
  uVar1 = (this->super_MobileElement).start_;
  uVar2 = (this->super_MobileElement).stop_;
  (this->super_MobileElement).start_ = iVar3 + uVar1;
  (this->super_MobileElement).stop_ = iVar3 + uVar2;
  return;
}

Assistant:

void Polymerase::Move() {

  if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ += 3;
    stop_ += 3;
  } else {
    start_++;
    stop_++;
  }
}